

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_add_between_face_interior
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  undefined8 in_XMM0_Qb;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  REF_INT ncell;
  REF_INT sense;
  REF_INT id;
  REF_INT cells [2];
  REF_DBL r0;
  REF_DBL r1;
  REF_DBL temp_xyz [3];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_INT nodes2 [27];
  REF_INT nodes3 [27];
  double local_200;
  int local_1ec;
  REF_INT local_1e8;
  REF_INT local_1e4;
  long local_1e0;
  REF_NODE local_1d8;
  REF_INT local_1d0;
  REF_INT local_1cc;
  REF_DBL local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a0;
  REF_DBL local_198;
  REF_DBL RStack_190;
  REF_DBL local_188;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  local_1c8 = node1_weight;
  uStack_1c0 = in_XMM0_Qb;
  uVar3 = ref_geom_unique_id(ref_geom,new_node,2,&local_1e4);
  if (uVar3 == 0) {
    local_1d8 = pRVar1;
    uVar3 = ref_cell_list_with2(ref_cell,node0,node1,2,&local_1ec,&local_1d0);
    if (uVar3 == 0) {
      if ((long)local_1ec != 2) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x464,"ref_geom_add_between_face_interior","expected two tri for box2 nodes",2,
               (long)local_1ec);
        return 1;
      }
      uVar3 = ref_cell_nodes(ref_cell,local_1d0,local_118);
      if (uVar3 == 0) {
        uVar3 = ref_cell_nodes(ref_cell,local_1cc,local_a8);
        if (uVar3 == 0) {
          uVar3 = ref_geom_cell_tuv(ref_geom,node0,local_118,2,&local_128,&local_1e8);
          if (uVar3 == 0) {
            uVar3 = ref_geom_cell_tuv(ref_geom,node1,local_118,2,&local_138,&local_1e8);
            if (uVar3 == 0) {
              local_168 = local_138;
              dStack_160 = dStack_130;
              local_178 = local_128;
              dStack_170 = dStack_120;
              local_1b8 = (1.0 - local_1c8) * local_128 + local_1c8 * local_138;
              dStack_1b0 = (1.0 - local_1c8) * dStack_120 + local_1c8 * dStack_130;
              pRVar2 = local_1d8->real;
              lVar7 = (long)(new_node * 0xf);
              local_198 = pRVar2[lVar7];
              RStack_190 = pRVar2[lVar7 + 1];
              local_188 = pRVar2[lVar7 + 2];
              RVar4 = ref_egads_invert(ref_geom,2,local_1e4,&local_198,&local_1b8);
              if ((RVar4 == 0) &&
                 (uVar3 = ref_geom_add(ref_geom,new_node,2,local_1e4,&local_1b8), uVar3 != 0)) {
                pcVar6 = "new geom";
                uVar5 = 0x476;
              }
              else {
                iVar8 = 10;
                local_1e0 = lVar7 << 3;
                local_158 = 0.0;
                local_200 = 1.0;
                local_148 = local_1c8;
                while( true ) {
                  lVar7 = local_1e0;
                  uStack_150 = 0;
                  local_198 = (1.0 - local_148) * local_178 + local_148 * local_168;
                  RStack_190 = (1.0 - local_148) * dStack_170 + local_148 * dStack_160;
                  uStack_140 = uStack_1c0;
                  uVar3 = ref_geom_add(ref_geom,new_node,2,local_1e4,&local_198);
                  pRVar1 = local_1d8;
                  if (uVar3 != 0) {
                    pcVar6 = "new geom";
                    uVar5 = 0x480;
                    goto LAB_0015437c;
                  }
                  uVar3 = ref_egads_eval_at(ref_geom,2,local_1e4,&local_198,
                                            (REF_DBL *)((long)local_1d8->real + lVar7),
                                            (REF_DBL *)0x0);
                  if (uVar3 != 0) break;
                  uVar3 = ref_node_ratio(pRVar1,node0,new_node,&local_1b8);
                  if (uVar3 != 0) {
                    pcVar6 = "get r0";
                    uVar5 = 0x484;
                    goto LAB_0015437c;
                  }
                  uVar3 = ref_node_ratio(pRVar1,node1,new_node,&local_1a0);
                  if (uVar3 != 0) {
                    pcVar6 = "get r1";
                    uVar5 = 0x485;
                    goto LAB_0015437c;
                  }
                  auVar11._0_8_ = (local_1a0 + local_1b8) * 1e+20;
                  auVar11._8_8_ = local_1b8;
                  auVar12._8_8_ = -local_1b8;
                  auVar12._0_8_ = -auVar11._0_8_;
                  auVar12 = maxpd(auVar11,auVar12);
                  if (auVar12._0_8_ <= auVar12._8_8_) {
                    return 0;
                  }
                  dVar9 = local_1b8 / (local_1a0 + local_1b8) - local_1c8;
                  if ((iVar8 != 10) &&
                     (((0.0 < local_158 && (dVar9 < 0.0)) || ((local_158 < 0.0 && (0.0 < dVar9))))))
                  {
                    local_200 = local_200 * 0.5;
                  }
                  dVar10 = 0.05;
                  if (dVar9 <= 0.05) {
                    dVar10 = dVar9;
                  }
                  local_158 = -0.05;
                  if (-0.05 <= dVar10) {
                    local_158 = dVar10;
                  }
                  dVar9 = local_158;
                  if (local_158 <= -local_158) {
                    dVar9 = -local_158;
                  }
                  if (dVar9 < 0.005) {
                    return 0;
                  }
                  local_148 = local_148 - local_200 * local_158;
                  dVar9 = 0.99;
                  if (local_148 <= 0.99) {
                    dVar9 = local_148;
                  }
                  uStack_1c0 = 0;
                  local_148 = 0.01;
                  if (0.01 <= dVar9) {
                    local_148 = dVar9;
                  }
                  iVar8 = iVar8 + -1;
                  if (iVar8 == 0) {
                    return 0;
                  }
                }
                pcVar6 = "eval";
                uVar5 = 0x483;
              }
            }
            else {
              pcVar6 = "cell uv1";
              uVar5 = 0x46b;
            }
          }
          else {
            pcVar6 = "cell uv0";
            uVar5 = 0x469;
          }
        }
        else {
          pcVar6 = "cell nodes";
          uVar5 = 0x466;
        }
      }
      else {
        pcVar6 = "cell nodes";
        uVar5 = 0x465;
      }
    }
    else {
      pcVar6 = "list";
      uVar5 = 0x463;
    }
  }
  else {
    pcVar6 = "unique face id";
    uVar5 = 0x461;
  }
LAB_0015437c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
         "ref_geom_add_between_face_interior",(ulong)uVar3,pcVar6);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_add_between_face_interior(
    REF_GRID ref_grid, REF_INT node0, REF_INT node1, REF_DBL node1_weight,
    REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT type, id;
  REF_DBL uv[2], uv0[2], uv1[2];
  REF_INT sense, ncell, cells[2];
  REF_INT nodes2[REF_CELL_MAX_SIZE_PER];
  REF_INT nodes3[REF_CELL_MAX_SIZE_PER];
  REF_DBL r0, r1;
  REF_DBL weight, actual, error, relax, last_error;
  REF_BOOL verbose = REF_FALSE;
  REF_INT i;

  type = REF_GEOM_FACE;
  RSS(ref_geom_unique_id(ref_geom, new_node, type, &id), "unique face id");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");
  RSS(ref_cell_nodes(ref_cell, cells[0], nodes2), "cell nodes");
  RSS(ref_cell_nodes(ref_cell, cells[1], nodes3), "cell nodes");

  RSS(ref_geom_cell_tuv(ref_geom, node0, nodes2, type, uv0, &sense),
      "cell uv0");
  RSS(ref_geom_cell_tuv(ref_geom, node1, nodes2, type, uv1, &sense),
      "cell uv1");

  {
    REF_DBL temp_uv[2], temp_xyz[3];
    temp_uv[0] = (1.0 - node1_weight) * uv0[0] + node1_weight * uv1[0];
    temp_uv[1] = (1.0 - node1_weight) * uv0[1] + node1_weight * uv1[1];
    temp_xyz[0] = ref_node_xyz(ref_node, 0, new_node);
    temp_xyz[1] = ref_node_xyz(ref_node, 1, new_node);
    temp_xyz[2] = ref_node_xyz(ref_node, 2, new_node);
    if (REF_SUCCESS ==
        ref_egads_invert(ref_geom, type, id, temp_xyz, temp_uv)) {
      RSS(ref_geom_add(ref_geom, new_node, type, id, temp_uv), "new geom");
    };
  }

  weight = node1_weight;
  relax = 1.0;
  error = 0.0;
  for (i = 0; i < 10; i++) {
    uv[0] = (1.0 - weight) * uv0[0] + weight * uv1[0];
    uv[1] = (1.0 - weight) * uv0[1] + weight * uv1[1];
    RSS(ref_geom_add(ref_geom, new_node, type, id, uv), "new geom");
    RSS(ref_egads_eval_at(ref_geom, type, id, uv,
                          ref_node_xyz_ptr(ref_node, new_node), NULL),
        "eval");
    RSS(ref_node_ratio(ref_node, node0, new_node, &r0), "get r0");
    RSS(ref_node_ratio(ref_node, node1, new_node, &r1), "get r1");
    if (!ref_math_divisible(r0, (r0 + r1))) break;
    actual = r0 / (r0 + r1);
    last_error = error;
    error = actual - node1_weight;
    if (i > 0 &&
        ((error < 0 && last_error > 0) || (error > 0 && last_error < 0)))
      relax *= 0.5;
    if (verbose)
      printf("target %f actual %f adjust %f errro %f\n", node1_weight, actual,
             weight, error);
    error = MAX(-0.05, MIN(0.05, error));
    weight = weight - relax * error;
    weight = MAX(0.01, MIN(0.99, weight));
    if (ABS(error) < 0.005) break;
  }

  return REF_SUCCESS;
}